

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::emit_sos(jpeg_encoder *this)

{
  uint8 i;
  uint uVar1;
  
  emit_marker(this,0xda);
  emit_word(this,(uint)this->m_num_components * 2 + 6);
  uVar1 = 0;
  i = this->m_num_components;
  while (emit_byte(this,i), uVar1 < this->m_num_components) {
    uVar1 = uVar1 + 1;
    emit_byte(this,(uint8)uVar1);
    i = '\x11';
    if (uVar1 == 1) {
      i = '\0';
    }
  }
  emit_byte(this,'\0');
  emit_byte(this,'?');
  emit_byte(this,'\0');
  return;
}

Assistant:

void jpeg_encoder::emit_sos() {
  emit_marker(M_SOS);
  emit_word(2 * m_num_components + 2 + 1 + 3);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));
    if (i == 0)
      emit_byte((0 << 4) + 0);
    else
      emit_byte((1 << 4) + 1);
  }
  emit_byte(0); /* spectral selection */
  emit_byte(63);
  emit_byte(0);
}